

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLText::ParseDeep(XMLText *this,char *p,StrPair *param_3)

{
  bool bVar1;
  char *pcVar2;
  undefined8 in_RDX;
  char *in_RSI;
  XMLText *in_RDI;
  int flags;
  char *start;
  int strFlags;
  XMLText *p_00;
  StrPair *in_stack_fffffffffffffff8;
  
  pcVar2 = in_RSI;
  p_00 = in_RDI;
  bVar1 = CData(in_RDI);
  strFlags = (int)((ulong)in_RDX >> 0x20);
  if (bVar1) {
    pcVar2 = StrPair::ParseText(in_stack_fffffffffffffff8,(char *)p_00,pcVar2,strFlags);
    if (pcVar2 == (char *)0x0) {
      XMLDocument::SetError
                ((in_RDI->super_XMLNode)._document,XML_ERROR_PARSING_CDATA,in_RSI,(char *)0x0);
    }
  }
  else {
    XMLDocument::ProcessEntities((in_RDI->super_XMLNode)._document);
    XMLDocument::WhitespaceMode((in_RDI->super_XMLNode)._document);
    pcVar2 = StrPair::ParseText(in_stack_fffffffffffffff8,(char *)p_00,pcVar2,strFlags);
    if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
      if (pcVar2 == (char *)0x0) {
        XMLDocument::SetError
                  ((in_RDI->super_XMLNode)._document,XML_ERROR_PARSING_TEXT,in_RSI,(char *)0x0);
      }
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = pcVar2 + -1;
    }
  }
  return pcVar2;
}

Assistant:

char* XMLText::ParseDeep( char* p, StrPair* )
{
    const char* start = p;
    if ( this->CData() ) {
        p = _value.ParseText( p, "]]>", StrPair::NEEDS_NEWLINE_NORMALIZATION );
        if ( !p ) {
            _document->SetError( XML_ERROR_PARSING_CDATA, start, 0 );
        }
        return p;
    }
    else {
        int flags = _document->ProcessEntities() ? StrPair::TEXT_ELEMENT : StrPair::TEXT_ELEMENT_LEAVE_ENTITIES;
        if ( _document->WhitespaceMode() == COLLAPSE_WHITESPACE ) {
            flags |= StrPair::NEEDS_WHITESPACE_COLLAPSING;
        }

        p = _value.ParseText( p, "<", flags );
        if ( p && *p ) {
            return p-1;
        }
        if ( !p ) {
            _document->SetError( XML_ERROR_PARSING_TEXT, start, 0 );
        }
    }
    return 0;
}